

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_fma::create_pipeline_fp16s(InnerProduct_x86_fma *this,Option *opt)

{
  Mat *this_00;
  Mat *this_01;
  uint _h;
  void *pvVar1;
  size_t sVar2;
  _func_int *p_Var3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  void *pvVar8;
  unsigned_short uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  unsigned_short *puVar21;
  undefined1 (*pauVar22) [16];
  undefined1 (*pauVar23) [16];
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  uint _w;
  long lVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uint local_d8;
  Mat local_b8;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  this_01 = (Mat *)(&this->field_0x130 + (long)this->_vptr_InnerProduct_x86_fma[-3]);
  _h = this_01[-2].h;
  _w = this_01[-2].c / (int)_h;
  this_00 = &this->weight_data_tm;
  if (opt->use_packing_layout == true) {
    if ((_h & 7) == 0) {
      Mat::reshape(&local_b8,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 3,0x10,8,(Allocator *)0x0);
      if (7 < (int)_h) {
        lVar20 = 1;
        lVar25 = 2;
        lVar26 = 3;
        lVar27 = 4;
        lVar12 = 5;
        lVar28 = 6;
        lVar33 = 7;
        lVar13 = 0;
        uVar31 = 0;
        do {
          pvVar8 = local_b8.data;
          lVar30 = (long)(this->weight_data_tm).w;
          pvVar1 = (this->weight_data_tm).data;
          sVar2 = (this->weight_data_tm).elemsize;
          puVar21 = (unsigned_short *)((uVar31 >> 3) * lVar30 * sVar2 + (long)pvVar1);
          lVar29 = (long)local_b8.w;
          if ((int)_w < 8) {
            lVar29 = local_b8.elemsize * lVar29;
            lVar14 = lVar29 * uVar31;
            lVar24 = (uVar31 | 1) * lVar29;
            lVar16 = (uVar31 | 2) * lVar29;
            lVar17 = (uVar31 | 3) * lVar29;
            lVar18 = (uVar31 | 4) * lVar29;
            lVar19 = (uVar31 | 5) * lVar29;
            lVar32 = (uVar31 | 6) * lVar29;
            lVar29 = lVar29 * (uVar31 | 7);
            uVar10 = 0;
          }
          else {
            lVar30 = sVar2 * lVar13 * lVar30;
            lVar14 = local_b8.elemsize * uVar31 * lVar29;
            lVar24 = local_b8.elemsize * lVar20 * lVar29;
            lVar16 = local_b8.elemsize * lVar25 * lVar29;
            lVar17 = local_b8.elemsize * lVar26 * lVar29;
            lVar18 = local_b8.elemsize * lVar27 * lVar29;
            lVar19 = local_b8.elemsize * lVar12 * lVar29;
            lVar32 = local_b8.elemsize * lVar28 * lVar29;
            lVar29 = local_b8.elemsize * lVar33 * lVar29;
            iVar15 = 7;
            lVar11 = 0;
            do {
              auVar34 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b8.data + lVar11 + lVar14)
                                       ,3);
              auVar36 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b8.data + lVar11 + lVar24)
                                       ,3);
              auVar38 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b8.data + lVar11 + lVar16)
                                       ,3);
              auVar39 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b8.data + lVar11 + lVar17)
                                       ,3);
              auVar40 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b8.data + lVar11 + lVar18)
                                       ,3);
              auVar41 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b8.data + lVar11 + lVar19)
                                       ,3);
              auVar42 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b8.data + lVar11 + lVar32)
                                       ,3);
              auVar43 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b8.data + lVar11 + lVar29)
                                       ,3);
              auVar6 = vpunpcklwd_avx(auVar34,auVar36);
              auVar34 = vpunpckhwd_avx(auVar34,auVar36);
              auVar7 = vpunpcklwd_avx(auVar38,auVar39);
              auVar36 = vpunpckhwd_avx(auVar38,auVar39);
              auVar5 = vpunpcklwd_avx(auVar40,auVar41);
              auVar38 = vpunpckhwd_avx(auVar40,auVar41);
              auVar40 = vpunpcklwd_avx(auVar42,auVar43);
              auVar39 = vpunpckhwd_avx(auVar42,auVar43);
              auVar41 = vpunpckldq_avx(auVar6,auVar7);
              auVar6 = vpunpckhdq_avx(auVar6,auVar7);
              auVar7 = vpunpckldq_avx(auVar34,auVar36);
              auVar34 = vpunpckhdq_avx(auVar34,auVar36);
              auVar42 = vpunpckldq_avx(auVar5,auVar40);
              auVar36 = vpunpckhdq_avx(auVar5,auVar40);
              auVar5 = vpunpckldq_avx(auVar38,auVar39);
              auVar38 = vpunpckhdq_avx(auVar38,auVar39);
              auVar40 = vpunpcklqdq_avx(auVar41,auVar42);
              auVar39 = vpunpckhqdq_avx(auVar41,auVar42);
              auVar41 = vpunpcklqdq_avx(auVar6,auVar36);
              auVar36 = vpunpckhqdq_avx(auVar6,auVar36);
              auVar42 = vpunpcklqdq_avx(auVar7,auVar5);
              auVar6 = vpunpckhqdq_avx(auVar7,auVar5);
              auVar7 = vpunpcklqdq_avx(auVar34,auVar38);
              auVar34 = vpunpckhqdq_avx(auVar34,auVar38);
              *(undefined1 (*) [16])((long)pvVar1 + lVar11 * 4 + lVar30) = auVar40;
              *(undefined1 (*) [16])((long)pvVar1 + lVar11 * 4 + lVar30 + 0x10) = auVar39;
              *(undefined1 (*) [16])((long)pvVar1 + lVar11 * 4 + lVar30 + 0x20) = auVar41;
              *(undefined1 (*) [16])((long)pvVar1 + lVar11 * 4 + lVar30 + 0x30) = auVar36;
              *(undefined1 (*) [16])((long)pvVar1 + lVar11 * 4 + lVar30 + 0x40) = auVar42;
              *(undefined1 (*) [16])((long)pvVar1 + lVar11 * 4 + lVar30 + 0x50) = auVar6;
              *(undefined1 (*) [16])((long)pvVar1 + lVar11 * 4 + lVar30 + 0x60) = auVar7;
              *(undefined1 (*) [16])((long)pvVar1 + lVar11 * 4 + lVar30 + 0x70) = auVar34;
              puVar21 = puVar21 + 0x40;
              lVar11 = lVar11 + 0x20;
              iVar15 = iVar15 + 8;
            } while (iVar15 < (int)_w);
            lVar14 = lVar14 + lVar11;
            lVar24 = lVar24 + lVar11;
            lVar16 = lVar16 + lVar11;
            lVar17 = lVar17 + lVar11;
            lVar18 = lVar18 + lVar11;
            lVar19 = lVar19 + lVar11;
            lVar32 = lVar32 + lVar11;
            lVar29 = lVar29 + lVar11;
            uVar10 = _w & 0xfffffff8;
          }
          local_70 = uVar31;
          local_68 = lVar13;
          local_60 = lVar33;
          local_58 = lVar28;
          local_50 = lVar12;
          local_48 = lVar27;
          local_40 = lVar26;
          local_38 = lVar25;
          if ((int)uVar10 < (int)_w) {
            lVar25 = 0;
            do {
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar25 * 4 + lVar14));
              *puVar21 = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar25 * 4 + lVar24));
              puVar21[1] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar25 * 4 + lVar16));
              puVar21[2] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar25 * 4 + lVar17));
              puVar21[3] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar25 * 4 + lVar18));
              puVar21[4] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar25 * 4 + lVar19));
              puVar21[5] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar25 * 4 + lVar32));
              puVar21[6] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar25 * 4 + lVar29));
              puVar21[7] = uVar9;
              puVar21 = puVar21 + 8;
              lVar25 = lVar25 + 1;
            } while (_w - uVar10 != (int)lVar25);
          }
          uVar31 = local_70 + 8;
          lVar13 = local_68 + 1;
          lVar20 = lVar20 + 8;
          lVar25 = local_38 + 8;
          lVar26 = local_40 + 8;
          lVar27 = local_48 + 8;
          lVar12 = local_50 + 8;
          lVar28 = local_58 + 8;
          lVar33 = local_60 + 8;
        } while ((int)((uint)uVar31 | 7) < (int)_h);
      }
      if (local_b8.refcount == (int *)0x0) goto LAB_002cc590;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto LAB_002cc590;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto LAB_002cc590;
      }
    }
    else {
      if ((_h & 3) != 0) goto LAB_002cbd7c;
      Mat::reshape(&local_b8,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 2,8,4,(Allocator *)0x0);
      if (3 < (int)_h) {
        local_d8 = _w & 0xfffffffc;
        lVar25 = 3;
        lVar26 = 2;
        lVar27 = 1;
        lVar20 = 0;
        uVar31 = 0;
        do {
          pvVar8 = local_b8.data;
          lVar12 = (long)(this->weight_data_tm).w;
          pvVar1 = (this->weight_data_tm).data;
          sVar2 = (this->weight_data_tm).elemsize;
          pauVar22 = (undefined1 (*) [16])((uVar31 >> 2) * lVar12 * sVar2 + (long)pvVar1);
          lVar28 = (long)local_b8.w;
          if ((int)_w < 4) {
            lVar28 = local_b8.elemsize * lVar28;
            lVar30 = lVar28 * uVar31;
            lVar29 = (uVar31 | 1) * lVar28;
            lVar33 = (uVar31 | 2) * lVar28;
            lVar13 = lVar28 * (uVar31 | 3);
            uVar10 = 0;
          }
          else {
            lVar13 = local_b8.elemsize * lVar25 * lVar28;
            lVar33 = local_b8.elemsize * lVar26 * lVar28;
            lVar29 = local_b8.elemsize * lVar27 * lVar28;
            lVar28 = local_b8.elemsize * uVar31 * lVar28;
            iVar15 = 3;
            lVar30 = 0;
            do {
              pauVar23 = pauVar22;
              auVar34 = *(undefined1 (*) [16])((long)local_b8.data + lVar30 + lVar28);
              auVar36 = *(undefined1 (*) [16])((long)local_b8.data + lVar30 + lVar29);
              auVar38 = *(undefined1 (*) [16])((long)local_b8.data + lVar30 + lVar33);
              auVar39 = *(undefined1 (*) [16])((long)local_b8.data + lVar30 + lVar13);
              auVar6 = vpunpckldq_avx(auVar34,auVar36);
              auVar7 = vpunpckldq_avx(auVar38,auVar39);
              auVar34 = vpunpckhdq_avx(auVar34,auVar36);
              auVar36 = vpunpckhdq_avx(auVar38,auVar39);
              auVar39 = vpunpcklqdq_avx(auVar6,auVar7);
              auVar38 = vpunpckhqdq_avx(auVar6,auVar7);
              auVar6 = vpunpcklqdq_avx(auVar34,auVar36);
              auVar34 = vpunpckhqdq_avx(auVar34,auVar36);
              auVar37._16_16_ = auVar38;
              auVar37._0_16_ = auVar39;
              auVar35._16_16_ = auVar34;
              auVar35._0_16_ = auVar6;
              pauVar22 = (undefined1 (*) [16])((long)pvVar1 + lVar30 * 2 + sVar2 * lVar20 * lVar12);
              auVar34 = vcvtps2ph_f16c(auVar37,3);
              *pauVar22 = auVar34;
              auVar34 = vcvtps2ph_f16c(auVar35,3);
              pauVar22[1] = auVar34;
              iVar15 = iVar15 + 4;
              lVar30 = lVar30 + 0x10;
              pauVar22 = pauVar22 + 2;
            } while (iVar15 < (int)_w);
            pauVar22 = pauVar23 + 2;
            lVar13 = lVar13 + lVar30;
            lVar33 = lVar33 + lVar30;
            lVar29 = lVar29 + lVar30;
            lVar30 = lVar28 + lVar30;
            uVar10 = local_d8;
          }
          if ((int)uVar10 < (int)_w) {
            lVar12 = 0;
            do {
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar12 * 4 + lVar30));
              *(unsigned_short *)(*pauVar22 + lVar12 * 8) = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar12 * 4 + lVar29));
              *(unsigned_short *)(*pauVar22 + lVar12 * 8 + 2) = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar12 * 4 + lVar33));
              *(unsigned_short *)(*pauVar22 + lVar12 * 8 + 4) = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar12 * 4 + lVar13));
              *(unsigned_short *)(*pauVar22 + lVar12 * 8 + 6) = uVar9;
              lVar12 = lVar12 + 1;
            } while (_w - uVar10 != (int)lVar12);
          }
          uVar31 = uVar31 + 4;
          lVar25 = lVar25 + 4;
          lVar26 = lVar26 + 4;
          lVar27 = lVar27 + 4;
          lVar20 = lVar20 + 1;
        } while ((int)((uint)uVar31 | 3) < (int)_h);
      }
      if (local_b8.refcount == (int *)0x0) goto LAB_002cc590;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto LAB_002cc590;
      if (local_b8.allocator != (Allocator *)0x0) {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
        goto LAB_002cc590;
      }
    }
  }
  else {
LAB_002cbd7c:
    Mat::reshape(&local_b8,this_01,_w,_h,(Allocator *)0x0);
    cast_float32_to_float16(&local_b8,this_00,opt);
    if (local_b8.refcount == (int *)0x0) goto LAB_002cc590;
    LOCK();
    *local_b8.refcount = *local_b8.refcount + -1;
    UNLOCK();
    if (*local_b8.refcount != 0) goto LAB_002cc590;
    if (local_b8.allocator != (Allocator *)0x0) {
      (*(local_b8.allocator)->_vptr_Allocator[3])();
      goto LAB_002cc590;
    }
  }
  if (local_b8.data != (void *)0x0) {
    free(local_b8.data);
  }
LAB_002cc590:
  if (opt->lightmode == true) {
    p_Var3 = this->_vptr_InnerProduct_x86_fma[-3];
    piVar4 = *(int **)(&this->field_0x138 + (long)p_Var3);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var3) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var3) != (void *)0x0) {
            free(*(void **)(&this->field_0x130 + (long)p_Var3));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var3) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var3) = 0;
    *(undefined1 (*) [16])(&this->field_0x13c + (long)p_Var3) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(&this->field_0x130 + (long)p_Var3) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(&this->field_0x158 + (long)p_Var3) = (undefined1  [16])0x0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var3) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}